

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O1

void __thiscall ON_SubDComponentRefList::Internal_Destroy(ON_SubDComponentRefList *this)

{
  ON_SubDComponentRef **ppOVar1;
  ON_SubDComponentRef *pOVar2;
  ulong uVar3;
  
  if ((this->m_list).m_count != 0) {
    uVar3 = 0;
    do {
      ppOVar1 = (this->m_list).m_a;
      pOVar2 = ppOVar1[uVar3];
      ppOVar1[uVar3] = (ON_SubDComponentRef *)0x0;
      if (pOVar2 != (ON_SubDComponentRef *)0x0) {
        (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (uint)(this->m_list).m_count);
  }
  if (-1 < (this->m_list).m_capacity) {
    (this->m_list).m_count = 0;
  }
  this->m_bIsClean = false;
  return;
}

Assistant:

void ON_SubDComponentRefList::Internal_Destroy()
{
  for (unsigned int i = 0; i < m_list.UnsignedCount(); i++)
  {
    ON_SubDComponentRef* p = m_list[i];
    m_list[i] = nullptr;
    if (nullptr != p)
      delete p;
  }
  m_list.SetCount(0);
  m_bIsClean = false;
}